

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall PClassActor::~PClassActor(PClassActor *this)

{
  DmgFactors *this_00;
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this_01;
  PClassActor *this_local;
  
  *(undefined ***)
   &(this->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
    super_PType.super_PTypeBase = &PTR_StaticType_009f5540;
  if ((this->OwnedStates != (FState *)0x0) && (this->OwnedStates != (FState *)0x0)) {
    operator_delete__(this->OwnedStates);
  }
  if ((this->DamageFactors != (DmgFactors *)0x0) &&
     (this_00 = this->DamageFactors, this_00 != (DmgFactors *)0x0)) {
    DmgFactors::~DmgFactors(this_00);
    operator_delete(this_00,0x18);
  }
  if ((this->PainChances != (PainChanceList *)0x0) &&
     (this_01 = this->PainChances,
     this_01 != (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)0x0)) {
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::~TMap(this_01);
    operator_delete(this_01,0x18);
  }
  if (this->StateList != (FStateLabels *)0x0) {
    FStateLabels::Destroy(this->StateList);
    M_Free(this->StateList);
  }
  FString::~FString(&this->SourceLumpName);
  FString::~FString(&this->HitObituary);
  FString::~FString(&this->Obituary);
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::~TArray(&this->VisibleToPlayerClass);
  PClass::~PClass(&this->super_PClass);
  return;
}

Assistant:

PClassActor::~PClassActor()
{
	if (OwnedStates != NULL)
	{
		delete[] OwnedStates;
	}
	if (DamageFactors != NULL)
	{
		delete DamageFactors;
	}
	if (PainChances != NULL)
	{
		delete PainChances;
	}
	if (StateList != NULL)
	{
		StateList->Destroy();
		M_Free(StateList);
	}
}